

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O3

void __thiscall cornerstone::raft_server::handle_prevote_resp(raft_server *this,resp_msg *resp)

{
  prevote_state *ppVar1;
  element_type *peVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar6;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [11];
  char *local_30;
  
  if ((this->prevote_state_)._M_t.
      super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
      ._M_t.
      super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
      .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>._M_head_impl ==
      (prevote_state *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30 = "Prevote has completed, term received: %llu, current term %llu";
    snprintf((char *)local_98,100,"Prevote has completed, term received: %llu, current term %llu",
             (resp->super_msg_base).term_,
             ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->term_);
    local_b8[0] = local_a8;
    sVar3 = strlen((char *)local_98);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,local_98,(long)local_98 + sVar3);
    (*peVar2->_vptr_logger[3])(peVar2,local_b8);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
  }
  else {
    std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base);
    local_98[0] = (long *)CONCAT44(local_98[0]._4_4_,(resp->super_msg_base).src_);
    pVar6 = std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<int_const&>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)(this->prevote_state_)._M_t.
                          super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
                          .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>._M_head_impl);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Prevote has from %d has been processed.","");
      (*peVar2->_vptr_logger[3])(peVar2,local_98);
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
    }
    else {
      ppVar1 = (this->prevote_state_)._M_t.
               super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
               ._M_t.
               super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
               .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>._M_head_impl;
      iVar4 = ppVar1->accepted_votes_;
      if (resp->accepted_ == true) {
        iVar4 = iVar4 + 1;
        ppVar1->accepted_votes_ = iVar4;
      }
      uVar5 = (this->peers_)._M_h._M_element_count + 1;
      if ((int)(uVar5 >> 1) < iVar4) {
        peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_30 = "Prevote passed for term %llu";
        snprintf((char *)local_98,100,"Prevote passed for term %llu",
                 ((this->state_).
                  super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 term_);
        local_b8[0] = local_a8;
        sVar3 = strlen((char *)local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,local_98,(long)local_98 + sVar3);
        (*peVar2->_vptr_logger[3])(peVar2,local_b8);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        become_candidate(this);
      }
      else if (uVar5 <= (ppVar1->voted_servers_)._M_h._M_element_count) {
        peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_30 = "Prevote failed for term %llu";
        snprintf((char *)local_98,100,"Prevote failed for term %llu",
                 ((this->state_).
                  super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 term_);
        local_b8[0] = local_a8;
        sVar3 = strlen((char *)local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,local_98,(long)local_98 + sVar3);
        (*peVar2->_vptr_logger[3])(peVar2,local_b8);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        ppVar1 = (this->prevote_state_)._M_t.
                 super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
                 .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>._M_head_impl;
        std::
        _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)ppVar1);
        ppVar1->accepted_votes_ = 0;
        restart_election_timer(this);
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
  }
  return;
}

Assistant:

void raft_server::handle_prevote_resp(resp_msg& resp)
{
    if (!prevote_state_)
    {
        l_->info(sstrfmt("Prevote has completed, term received: %llu, current term %llu")
                     .fmt(resp.get_term(), state_->get_term()));
        return;
    }

    {
        read_lock(peers_lock_);
        bool vote_added = prevote_state_->add_voted_server(resp.get_src());
        if (!vote_added)
        {
            l_->info("Prevote has from %d has been processed.");
            return;
        }

        if (resp.get_accepted())
        {
            prevote_state_->inc_accepted_votes();
        }

        if (prevote_state_->get_accepted_votes() > (int32)((peers_.size() + 1) / 2))
        {
            l_->info(sstrfmt("Prevote passed for term %llu").fmt(state_->get_term()));
            become_candidate();
        }
        else if (prevote_state_->num_of_votes() >= (peers_.size() + 1))
        {
            l_->info(sstrfmt("Prevote failed for term %llu").fmt(state_->get_term()));
            prevote_state_->reset();  // still in prevote state, just reset the prevote state
            restart_election_timer(); // restart election timer for a new round of prevote
        }
    }
}